

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::FragmentOutputCase::init(FragmentOutputCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  Context *pCVar1;
  FragmentOutputCase *pFVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  char *__s;
  size_t sVar6;
  ostream *poVar7;
  pointer pFVar8;
  ShaderProgram *this_01;
  pointer puVar9;
  NotSupportedError *pNVar10;
  TestError *this_02;
  long lVar11;
  pointer pBVar12;
  char *pcVar13;
  pointer_____offset_0x10___ *ppuVar14;
  uint uVar15;
  int elemNdx;
  int iVar16;
  long lVar17;
  long lVar18;
  ostringstream vtx;
  ostringstream frag;
  ProgramSources sources;
  undefined1 auStack_478 [8];
  FragmentOutputCase *local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  long local_460;
  pointer local_458;
  char *local_450;
  char *local_448;
  RenderContext *local_440;
  value_type local_438;
  value_type local_418;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Alloc_hider local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8 [4];
  ios_base local_388 [8];
  ios_base local_380 [264];
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  ios_base local_208 [264];
  undefined1 local_100 [16];
  undefined1 local_f0 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_460 = CONCAT44(extraout_var,iVar4);
  local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  for (pBVar12 = (this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pBVar12 !=
      (this->m_fboSpec).
      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish; pBVar12 = pBVar12 + 1) {
    pCVar1 = (this->super_TestCase).m_context;
    bVar3 = glu::isSizedFormatColorRenderable
                      (pCVar1->m_renderCtx,pCVar1->m_contextInfo,pBVar12->format);
    if (!bVar3) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_3f8._0_8_ = &local_3e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f8,"Unsupported attachment format","");
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_3f8);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_440 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_470 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 300 es\n",0x10);
  pFVar8 = (local_470->m_outputs).
           super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_470->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8) >> 4)) {
    lVar17 = 0;
    do {
      iVar4 = pFVar8[lVar17].arrayLength;
      __s = glu::getDataTypeName(pFVar8[lVar17].type);
      pFVar8 = pFVar8 + lVar17;
      local_448 = glu::getPrecisionName(pFVar8->precision);
      uVar15 = pFVar8->type - TYPE_FLOAT;
      local_450 = "flat";
      pcVar13 = local_448;
      if (uVar15 < 4) {
        local_450 = "smooth";
        pcVar13 = "highp";
      }
      iVar16 = (int)lVar17;
      local_458 = pFVar8;
      if (iVar4 < 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"in ",3);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)auStack_478 + (int)*(undefined8 *)(local_3f8._0_8_ + -0x18) + 0x80);
        }
        else {
          sVar6 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,pcVar13,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_478 + (int)*(undefined8 *)(local_3f8._0_8_ + -0x18) + 0x80);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," in",3);
        poVar7 = (ostream *)std::ostream::operator<<(local_3f8,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
        lVar11 = (ulong)(uVar15 < 4) * 2 + 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_450,lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," out ",5);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," var",4);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,local_450,lVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," in ",4);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)auStack_478 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x200);
        }
        else {
          sVar6 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar13,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_478 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x200);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," var",4);
        poVar7 = (ostream *)std::ostream::operator<<(local_278,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"layout(location = ",0x12);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_458->location);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") out ",6);
        pcVar13 = local_448;
        if (local_448 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_448);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," out",4);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
        lVar11 = 2;
        pcVar13 = ";\n";
      }
      else {
        if (0 < pFVar8->arrayLength) {
          lVar11 = (ulong)(uVar15 < 4) * 2 + 4;
          iVar4 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"in ",3);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)auStack_478 + (int)*(undefined8 *)(local_3f8._0_8_ + -0x18) +
                              0x80);
            }
            else {
              sVar6 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,pcVar13,sVar6)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," ",1);
            if (__s == (char *)0x0) {
              std::ios::clear((int)auStack_478 + (int)*(undefined8 *)(local_3f8._0_8_ + -0x18) +
                              0x80);
            }
            else {
              sVar6 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,__s,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," in",3);
            poVar7 = (ostream *)std::ostream::operator<<(local_3f8,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_450,lVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," out ",5);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)poVar7->_vptr_basic_ostream[-3] + (int)poVar7);
            }
            else {
              sVar6 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            if (__s == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
            }
            else {
              sVar6 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," var",4);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,local_450,lVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," in ",4);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)auStack_478 + (int)*(_func_int **)(local_278._0_8_ + -0x18) +
                              0x200);
            }
            else {
              sVar6 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar13,sVar6)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
            if (__s == (char *)0x0) {
              std::ios::clear((int)auStack_478 + (int)*(_func_int **)(local_278._0_8_ + -0x18) +
                              0x200);
            }
            else {
              sVar6 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," var",4);
            poVar7 = (ostream *)std::ostream::operator<<(local_278,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
            iVar4 = iVar4 + 1;
          } while (iVar4 < local_458->arrayLength);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"layout(location = ",0x12);
        poVar7 = (ostream *)std::ostream::operator<<(local_278,local_458->location);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") out ",6);
        pcVar13 = local_448;
        if (local_448 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_448);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," out",4);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_458->arrayLength);
        lVar11 = 3;
        pcVar13 = "];\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,lVar11);
      lVar17 = lVar17 + 1;
      pFVar8 = (local_470->m_outputs).
               super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar17 < (int)((ulong)((long)(local_470->m_outputs).
                                          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8)
                           >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"\nvoid main()\n{\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\nvoid main()\n{\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"\tgl_Position = a_position;\n",0x1b);
  pFVar8 = (local_470->m_outputs).
           super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_470->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8) >> 4)) {
    lVar17 = 0;
    do {
      iVar4 = (int)lVar17;
      if (pFVar8[lVar17].arrayLength < 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"\tvar",4);
        poVar7 = (ostream *)std::ostream::operator<<(local_3f8,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = in",5);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\tout",4);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_278,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = var",6);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
      }
      else {
        iVar16 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"\tvar",4);
          poVar7 = (ostream *)std::ostream::operator<<(local_3f8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = in",5);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\tout",4);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_278,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = var",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
          iVar16 = iVar16 + 1;
        } while (iVar16 < pFVar8[lVar17].arrayLength);
      }
      lVar17 = lVar17 + 1;
      pFVar8 = (local_470->m_outputs).
               super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar17 < (int)((ulong)((long)(local_470->m_outputs).
                                          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8)
                           >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,&local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f0 + 8),&local_418);
  glu::ShaderProgram::ShaderProgram(this_01,local_440,(ProgramSources *)local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::ios_base::~ios_base(local_388);
  pFVar2 = local_470;
  local_470->m_program = this_01;
  glu::operator<<((TestLog *)&local_468->_M_allocated_capacity,this_01);
  if ((pFVar2->m_program->m_program).m_info.linkOk == false) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)pNVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x101);
    ppuVar14 = &tcu::TestError::typeinfo;
  }
  else {
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Framebuffer","");
    local_100._0_8_ = (pointer)local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Framebuffer configuration","");
    tcu::LogSection::LogSection((LogSection *)local_3f8,(string *)local_278,(string *)local_100);
    tcu::TestLog::startSection
              ((TestLog *)&local_468->_M_allocated_capacity,(char *)local_3f8._0_8_,local_3d8._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_p != local_3c8) {
      operator_delete(local_3d8._M_p,local_3c8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._0_8_ != &local_3e8) {
      operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
    }
    if ((pointer)local_100._0_8_ != (pointer)local_f0) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_f0._0_8_ + 1));
    }
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
    if (0 < (int)((ulong)((long)(local_470->m_fboSpec).
                                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_470->m_fboSpec).
                               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      this_00 = (ostringstream *)(local_3f8 + 8);
      lVar11 = 0;
      lVar17 = 0;
      do {
        local_3f8._0_8_ = local_468;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"COLOR_ATTACHMENT",0x10);
        std::ostream::operator<<(this_00,(int)lVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
        local_278._8_4_ =
             *(int *)((long)&((local_470->m_fboSpec).
                              super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start)->format + lVar11);
        local_278._0_8_ = glu::getTextureFormatName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_278,(ostream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<
                  (this_00,*(int *)((long)&((local_470->m_fboSpec).
                                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->width +
                                   lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
        std::ostream::operator<<
                  (this_00,*(int *)((long)&((local_470->m_fboSpec).
                                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->height +
                                   lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<
                  (this_00,*(int *)((long)&((local_470->m_fboSpec).
                                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->samples +
                                   lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," samples",8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_380);
        lVar17 = lVar17 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar17 < (int)((ulong)((long)(local_470->m_fboSpec).
                                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_470->m_fboSpec).
                                           super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    tcu::TestLog::endSection((TestLog *)&local_468->_M_allocated_capacity);
    pFVar2 = local_470;
    local_3f8._0_8_ = local_3f8._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_470->m_renderbuffers,
               (long)(local_470->m_fboSpec).
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_470->m_fboSpec).
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,
               (value_type_conflict4 *)local_3f8);
    lVar17 = local_460;
    (**(code **)(local_460 + 0x6d0))(1,&pFVar2->m_framebuffer);
    (**(code **)(lVar17 + 0x6e8))
              ((ulong)((long)(pFVar2->m_renderbuffers).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(pFVar2->m_renderbuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    (**(code **)(lVar17 + 0x78))(0x8d40,pFVar2->m_framebuffer);
    puVar9 = (pFVar2->m_renderbuffers).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pFVar2->m_renderbuffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) >> 2)) {
      lVar11 = 0xc;
      lVar18 = 0;
      do {
        uVar15 = puVar9[lVar18];
        pBVar12 = (pFVar2->m_fboSpec).
                  super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(local_460 + 0xa0))(0x8d41,uVar15);
        (**(code **)(local_460 + 0x1240))
                  (0x8d41,*(undefined4 *)((long)&pBVar12->format + lVar11),
                   *(undefined4 *)((long)pBVar12 + lVar11 + -0xc),
                   *(undefined4 *)((long)pBVar12 + lVar11 + -8),
                   *(undefined4 *)((long)pBVar12 + lVar11 + -4));
        lVar17 = local_460;
        (**(code **)(local_460 + 0x688))(0x8d40,(int)lVar18 + 0x8ce0,0x8d41,uVar15);
        lVar18 = lVar18 + 1;
        puVar9 = (pFVar2->m_renderbuffers).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x10;
      } while (lVar18 < (int)((ulong)((long)(pFVar2->m_renderbuffers).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar9) >> 2));
    }
    dVar5 = (**(code **)(lVar17 + 0x800))();
    glu::checkError(dVar5,"After framebuffer setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                    ,0x120);
    iVar4 = (**(code **)(lVar17 + 0x170))(0x8d40);
    if (iVar4 == 0x8cd5) {
      (**(code **)(lVar17 + 0x78))(0x8d40,0);
      dVar5 = (**(code **)(lVar17 + 0x800))();
      glu::checkError(dVar5,"After init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                      ,0x129);
      return extraout_EAX;
    }
    if (iVar4 != 0x8cdd) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"Incomplete framebuffer: ","");
      local_438._M_dataplus._M_p = (pointer)glu::getFramebufferStatusName;
      local_438._M_string_length._0_4_ = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)local_100,&local_438);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      tcu::TestError::TestError
                (this_02,(char *)local_3f8._0_8_,::glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                 ,0x126);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"Framebuffer not supported",::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x124);
    ppuVar14 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(pNVar10,ppuVar14,tcu::Exception::~Exception);
}

Assistant:

void FragmentOutputCase::init (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	// Check that all attachments are supported
	for (std::vector<BufferSpec>::const_iterator bufIter = m_fboSpec.begin(); bufIter != m_fboSpec.end(); ++bufIter)
	{
		if (!glu::isSizedFormatColorRenderable(m_context.getRenderContext(), m_context.getContextInfo(), bufIter->format))
			throw tcu::NotSupportedError("Unsupported attachment format");
	}

	DE_ASSERT(!m_program);
	m_program = createProgram(m_context.getRenderContext(), m_outputs);

	log << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Compile failed");

	// Print render target info to log.
	log << TestLog::Section("Framebuffer", "Framebuffer configuration");

	for (int ndx = 0; ndx < (int)m_fboSpec.size(); ndx++)
		log << TestLog::Message << "COLOR_ATTACHMENT" << ndx << ": "
								<< glu::getTextureFormatStr(m_fboSpec[ndx].format) << ", "
								<< m_fboSpec[ndx].width << "x" << m_fboSpec[ndx].height << ", "
								<< m_fboSpec[ndx].samples << " samples"
			<< TestLog::EndMessage;

	log << TestLog::EndSection;

	// Create framebuffer.
	m_renderbuffers.resize(m_fboSpec.size(), 0);
	gl.genFramebuffers(1, &m_framebuffer);
	gl.genRenderbuffers((int)m_renderbuffers.size(), &m_renderbuffers[0]);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	for (int bufNdx = 0; bufNdx < (int)m_renderbuffers.size(); bufNdx++)
	{
		deUint32			rbo			= m_renderbuffers[bufNdx];
		const BufferSpec&	bufSpec		= m_fboSpec[bufNdx];
		deUint32			attachment	= GL_COLOR_ATTACHMENT0+bufNdx;

		gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, bufSpec.samples, bufSpec.format, bufSpec.width, bufSpec.height);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After framebuffer setup");

	deUint32 fboStatus = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
	if (fboStatus == GL_FRAMEBUFFER_UNSUPPORTED)
		throw tcu::NotSupportedError("Framebuffer not supported", "", __FILE__, __LINE__);
	else if (fboStatus != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::TestError((string("Incomplete framebuffer: ") + glu::getFramebufferStatusStr(fboStatus).toString()).c_str(), "", __FILE__, __LINE__);

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After init");
}